

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void UnserializeFromVector<DataStream,ParamsWrapper<TransactionSerParams,CMutableTransaction>>
               (DataStream *s,ParamsWrapper<TransactionSerParams,_CMutableTransaction> *args)

{
  long lVar1;
  pointer pbVar2;
  size_type sVar3;
  pointer pbVar4;
  uint64_t uVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = ReadCompactSize<DataStream>(s,true);
  pbVar2 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar3 = s->m_read_pos;
  pbVar4 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction>::Unserialize<DataStream>(args,s);
  if ((s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish +
      (uVar5 - (long)((s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                      _M_impl.super__Vector_impl_data._M_start + s->m_read_pos)) ==
      pbVar2 + -(long)(pbVar4 + sVar3)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    pcVar6 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar6,(error_code *)"Size of value was not the stated size");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void UnserializeFromVector(Stream& s, X&&... args)
{
    size_t expected_size = ReadCompactSize(s);
    size_t remaining_before = s.size();
    UnserializeMany(s, args...);
    size_t remaining_after = s.size();
    if (remaining_after + expected_size != remaining_before) {
        throw std::ios_base::failure("Size of value was not the stated size");
    }
}